

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

t_object * __thiscall xemmai::t_module::f_load_script(t_module *this,wstring_view a_path)

{
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  char *__filename;
  FILE *__p;
  t_global *ptVar1;
  t_type *ptVar2;
  t_object *__p_00;
  __pointer_type ptVar3;
  t_script *a_module;
  wchar_t *in_RCX;
  t_slot *this_02;
  long *in_FS_OFFSET;
  wstring_view a_string;
  t_emit local_4a0;
  t_parser local_450;
  t_object *local_390;
  t_object *body_1;
  t_emit local_380;
  t_parser local_330;
  t_debug_script *local_270;
  t_debug_script *script;
  t_object *body;
  t_engine *engine;
  t_scope scope;
  undefined1 local_c8 [8];
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> close;
  string local_90;
  FILE *local_70;
  FILE *stream;
  wstring_view a_path_local;
  __pointer_type p;
  
  a_path_local._M_len = a_path._M_len;
  a_string._M_str = in_RCX;
  a_string._M_len = a_path_local._M_len;
  stream = (FILE *)this;
  portable::f_convert_abi_cxx11_(&local_90,(portable *)this,a_string);
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&local_90);
  __p = fopen(__filename,"r");
  std::__cxx11::string::~string((string *)&local_90);
  if (__p == (FILE *)0x0) {
    a_path_local._M_str = (wchar_t *)0x0;
  }
  else {
    scope.v_junction.v_nexts.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)fclose;
    local_70 = __p;
    std::unique_ptr<_IO_FILE,int(*)(_IO_FILE*)>::unique_ptr<int(*)(_IO_FILE*),void>
              ((unique_ptr<_IO_FILE,int(*)(_IO_FILE*)> *)local_c8,(pointer)__p,
               (__enable_if_t<_is_lvalue_reference<int_(*)(_IO_FILE_*)>::value,_int_(*&&)(_IO_FILE_*)>
                )&scope.v_junction.v_nexts.
                  super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ast::t_scope::t_scope((t_scope *)&engine,(t_scope *)0x0);
    body = (t_object *)f_engine();
    if (((t_engine *)body)->v_debugger == (t_debugger *)0x0) {
      ptVar1 = f_global();
      ptVar2 = t_global::f_type<xemmai::t_module::t_body>(ptVar1);
      local_390 = t_type_of<xemmai::t_object>::
                  f_new<xemmai::t_script,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
                            (ptVar2,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                    &stream);
      a_module = t_object::f_as<xemmai::t_script>(local_390);
      t_parser::t_parser(&local_450,a_module,(FILE *)local_70);
      t_parser::operator()(&local_450,(t_scope *)&engine);
      t_parser::~t_parser(&local_450);
      t_emit::t_emit(&local_4a0,local_390,
                     (map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
                      *)0x0);
      a_path_local._M_str = (wchar_t *)t_emit::operator()(&local_4a0,(t_scope *)&engine);
    }
    else {
      ptVar1 = f_global();
      ptVar2 = t_global::f_type<xemmai::t_module::t_body>(ptVar1);
      script = (t_debug_script *)
               t_type_of<xemmai::t_object>::
               f_new<xemmai::t_debug_script,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
                         (ptVar2,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&stream);
      local_270 = t_object::f_as<xemmai::t_debug_script>((t_object *)script);
      t_parser::t_parser(&local_330,&local_270->super_t_script,(FILE *)local_70);
      t_parser::operator()(&local_330,(t_scope *)&engine);
      t_parser::~t_parser(&local_330);
      t_emit::t_emit(&local_380,(t_object *)script,&local_270->v_safe_points);
      __p_00 = t_emit::operator()(&local_380,(t_scope *)&engine);
      this_02 = &local_270->v_code;
      if ((t_object *)0x4 < __p_00) {
        this_00 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
        *this_00->v_head = __p_00;
        if (this_00->v_head == this_00->v_next) {
          t_slot::t_queue<128UL>::f_next(this_00);
        }
        else {
          this_00->v_head = this_00->v_head + 1;
        }
      }
      ptVar3 = std::atomic<xemmai::t_object_*>::exchange(&this_02->v_p,__p_00,relaxed);
      if ((__pointer_type)0x4 < ptVar3) {
        this_01 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
        *this_01->v_head = ptVar3;
        if (this_01->v_head == this_01->v_next) {
          t_slot::t_queue<256UL>::f_next(this_01);
        }
        else {
          this_01->v_head = this_01->v_head + 1;
        }
      }
      t_engine::f_debug_script_loaded((t_engine *)body,local_270);
      a_path_local._M_str = (wchar_t *)t_slot::operator_cast_to_t_object_(&local_270->v_code);
    }
    body_1._4_4_ = 1;
    ast::t_scope::~t_scope((t_scope *)&engine);
    std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr
              ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_c8);
  }
  return (t_object *)a_path_local._M_str;
}

Assistant:

t_object* t_module::f_load_script(std::wstring_view a_path)
{
	auto stream = std::fopen(portable::f_convert(a_path).c_str(), "r");
	if (!stream) return nullptr;
	std::unique_ptr<std::FILE, int(*)(std::FILE*)> close(stream, std::fclose);
	ast::t_scope scope(nullptr);
	if (auto engine = f_engine(); engine->v_debugger) {
		auto body = f_global()->f_type<t_module::t_body>()->f_new<t_debug_script>(a_path);
		auto& script = body->f_as<t_debug_script>();
		t_parser(script, stream)(scope);
		script.v_code = t_emit(body, &script.v_safe_points)(scope);
		engine->f_debug_script_loaded(script);
		return script.v_code;
	} else {
		auto body = f_global()->f_type<t_module::t_body>()->f_new<t_script>(a_path);
		t_parser(body->f_as<t_script>(), stream)(scope);
		return t_emit(body, nullptr)(scope);
	}
}